

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O0

bool __thiscall
boost::numeric::ublas::
compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
::const_iterator2::operator==(const_iterator2 *this,const_iterator2 *it)

{
  bool local_21;
  const_iterator2 *it_local;
  const_iterator2 *this_local;
  bool local_1;
  
  if ((this->rank_ == 1) || (it->rank_ == 1)) {
    local_1 = this->it_ == it->it_;
  }
  else {
    local_21 = false;
    if (this->i_ == it->i_) {
      local_21 = this->j_ == it->j_;
    }
    local_1 = local_21;
  }
  return local_1;
}

Assistant:

BOOST_UBLAS_INLINE
            bool operator == (const const_iterator2 &it) const {
                BOOST_UBLAS_CHECK (&(*this) () == &it (), external_logic ());
                // BOOST_UBLAS_CHECK (rank_ == it.rank_, internal_logic ());
                if (rank_ == 1 || it.rank_ == 1) {
                    return it_ == it.it_;
                } else {
                    return i_ == it.i_ && j_ == it.j_;
                }
            }